

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Moira.cpp
# Opt level: O0

void __thiscall moira::Moira::processException<(moira::Core)1>(Moira *this,exception *exc)

{
  long *plVar1;
  exception *this_00;
  long local_b0;
  long local_a0;
  long local_90;
  DoubleFault *df;
  DoubleFault *df_1;
  BusError *be;
  AddressError *ae;
  exception *exc_local;
  Moira *this_local;
  
  if (exc == (exception *)0x0) {
    local_90 = 0;
  }
  else {
    local_90 = __dynamic_cast(exc,&std::exception::typeinfo,&AddressError::typeinfo,0);
  }
  if (local_90 == 0) {
    if (exc == (exception *)0x0) {
      local_a0 = 0;
    }
    else {
      local_a0 = __dynamic_cast(exc,&std::exception::typeinfo,&BusError::typeinfo,0);
    }
    if (local_a0 == 0) {
      if (exc == (exception *)0x0) {
        local_b0 = 0;
      }
      else {
        local_b0 = __dynamic_cast(exc,&std::exception::typeinfo,&DoubleFault::typeinfo,0);
      }
      if (local_b0 != 0) {
        plVar1 = (long *)__cxa_allocate_exception(8);
        *plVar1 = local_b0;
        __cxa_throw(plVar1,&DoubleFault_const*::typeinfo,0);
      }
      this_00 = (exception *)__cxa_allocate_exception(8);
      std::exception::exception(this_00,exc);
      __cxa_throw(this_00,&std::exception::typeinfo,std::exception::~exception);
    }
    execBusError<(moira::Core)1>(this,*(StackFrame *)(local_a0 + 8),0);
  }
  else {
    execAddressError<(moira::Core)1>(this,*(StackFrame *)(local_90 + 8),0);
  }
  return;
}

Assistant:

void
Moira::processException(const std::exception &exc)
{
    try {

        if (auto ae = dynamic_cast<const AddressError *>(&exc); ae) {

            execAddressError<C>(ae->stackFrame);
            return;
        }

        if (auto be = dynamic_cast<const BusError *>(&exc); be) {

            execBusError<C>(be->stackFrame);
            return;
        }

        if (auto df = dynamic_cast<const DoubleFault *>(&exc); df) {

            throw df;
        }

    } catch (DoubleFault &df) {

        halt();
        return;
    }

    throw exc;
}